

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

void matd_plu_destroy(matd_plu_t *mlu)

{
  if (mlu->lu != (matd_t *)0x0) {
    free(mlu->lu);
  }
  free(mlu->piv);
  free(mlu);
  return;
}

Assistant:

void matd_plu_destroy(matd_plu_t *mlu)
{
    matd_destroy(mlu->lu);
    free(mlu->piv);
    memset(mlu, 0, sizeof(matd_plu_t));
    free(mlu);
}